

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Arguments::parse(Arguments *this,int argc,char **argv)

{
  bool bVar1;
  long lVar2;
  StringView local_50;
  StringView local_40;
  
  for (lVar2 = 1; lVar2 < argc; lVar2 = lVar2 + 1) {
    local_40.string = argv[lVar2];
    local_40.length = StringView::strlen(local_40.string);
    local_50.string = "-c";
    local_50.length = StringView::strlen("-c");
    bVar1 = StringView::operator==(&local_40,&local_50);
    if (bVar1) {
      this->codegen = CodegenC::codegen;
    }
    else {
      local_40.string = argv[lVar2];
      local_40.length = StringView::strlen(local_40.string);
      local_50.string = "-js";
      local_50.length = StringView::strlen("-js");
      bVar1 = StringView::operator==(&local_40,&local_50);
      if (bVar1) {
        this->codegen = CodegenJS::codegen;
      }
      else {
        this->source_path = argv[lVar2];
      }
    }
  }
  return;
}

Assistant:

void parse(int argc, char** argv) {
		for (int i = 1; i < argc; ++i) {
			if (StringView(argv[i]) == "-c") codegen = CodegenC::codegen;
			else if (StringView(argv[i]) == "-js") codegen = CodegenJS::codegen;
			else source_path = argv[i];
		}
	}